

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<float>::iuCsvFileParamsGenerator
          (iuCsvFileParamsGenerator<float> *this,string *path,char delimiter)

{
  _Vector_base<float,_std::allocator<float>_> local_30;
  
  (this->super_iuValuesInParamsGenerator<float>).super_iuIParamGenerator<int>.
  _vptr_iuIParamGenerator = (_func_int **)&PTR__iuValuesInParamsGenerator_001438d0;
  ReadParams((params_t *)&local_30,this,path,delimiter);
  iuValuesInParamsGenerator<float>::iuValuesInParamsGenerator
            (&this->super_iuValuesInParamsGenerator<float>,(params_t *)&local_30);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_30);
  (this->super_iuValuesInParamsGenerator<float>).super_iuIParamGenerator<int>.
  _vptr_iuIParamGenerator = (_func_int **)&PTR__iuValuesInParamsGenerator_001438d0;
  return;
}

Assistant:

explicit iuCsvFileParamsGenerator(const ::std::string& path, char delimiter = ',')
        : iuValuesInParamsGenerator<T>(ReadParams(path, delimiter))
    {
    }